

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O0

int buffer_bget(buffer *s,char *buf,uint len)

{
  int r;
  uint len_local;
  char *buf_local;
  buffer *s_local;
  
  if (s->p == 0) {
    if (len < s->n) {
      s_local._4_4_ = buffer_feed(s);
      if (0 < s_local._4_4_) {
        s_local._4_4_ = getthis(s,buf,len);
      }
    }
    else {
      s_local._4_4_ = oneread(s->op,s->fd,buf,s->n);
    }
  }
  else {
    s_local._4_4_ = getthis(s,buf,len);
  }
  return s_local._4_4_;
}

Assistant:

int buffer_bget(buffer *s,char *buf,unsigned int len)
{
  int r;
 
  if (s->p > 0) return getthis(s,buf,len);
  if (s->n <= len) return oneread(s->op,s->fd,buf,s->n);
  r = buffer_feed(s); if (r <= 0) return r;
  return getthis(s,buf,len);
}